

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O1

ecs_table_t * find_or_create_table_exclude(ecs_world_t *world,ecs_table_t *node,ecs_entity_t remove)

{
  ecs_vector_t *vector;
  ecs_entity_t eVar1;
  long lVar2;
  uint uVar3;
  void *pvVar4;
  ecs_table_t *node_00;
  ecs_edge_t *peVar5;
  int iVar6;
  ulong uVar7;
  ecs_entity_t aeStack_70 [2];
  undefined1 local_60 [8];
  ecs_entities_t entities;
  
  vector = node->type;
  aeStack_70[0] = 0x1275e8;
  entities.array._0_4_ = ecs_vector_count(vector);
  lVar2 = -((long)((int)entities.array * 8) + 0xfU & 0xfffffffffffffff0);
  local_60 = (undefined1  [8])((long)aeStack_70 + lVar2 + 8);
  entities._8_8_ = local_60;
  *(undefined8 *)((long)aeStack_70 + lVar2) = 0x127616;
  uVar3 = ecs_vector_count(vector);
  *(undefined8 *)((long)aeStack_70 + lVar2) = 0x12762b;
  pvVar4 = _ecs_vector_first(vector,8,0x10);
  if ((int)uVar3 < 1) {
    iVar6 = 0;
  }
  else {
    uVar7 = 0;
    iVar6 = 0;
    do {
      eVar1 = *(ecs_entity_t *)((long)pvVar4 + uVar7 * 8);
      if (eVar1 != remove) {
        *(ecs_entity_t *)(entities._8_8_ + (long)iVar6 * 8) = eVar1;
        *(undefined8 *)((long)aeStack_70 + lVar2) = 0x12767b;
        _ecs_assert(iVar6 < (int)uVar3,0xc,(char *)0x0,"el <= count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                    ,0x15c);
        if ((int)uVar3 <= iVar6) {
          *(code **)((long)aeStack_70 + lVar2) = ecs_table_traverse_add;
          __assert_fail("el <= count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                        ,0x15c,
                        "void remove_entity_from_type(ecs_type_t, ecs_entity_t, ecs_entities_t *)");
        }
        iVar6 = iVar6 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  entities.array._0_4_ = iVar6;
  *(undefined8 *)((long)aeStack_70 + lVar2) = 0x1276a1;
  node_00 = ecs_table_find_or_create(world,(ecs_entities_t *)local_60);
  if (node_00 == (ecs_table_t *)0x0) {
    node_00 = (ecs_table_t *)0x0;
  }
  else if (node_00 != node) {
    *(undefined8 *)((long)aeStack_70 + lVar2) = 0x1276be;
    peVar5 = get_edge(node_00,remove);
    if (peVar5->add == (ecs_table_t *)0x0) {
      peVar5->add = node;
    }
  }
  return node_00;
}

Assistant:

static
ecs_table_t *find_or_create_table_exclude(
    ecs_world_t * world,
    ecs_table_t * node,
    ecs_entity_t remove)
{
    ecs_type_t type = node->type;
    int32_t count = ecs_vector_count(type);

    ecs_entities_t entities = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * count),
        .count = count
    };

    remove_entity_from_type(type, remove, &entities);

    ecs_table_t *result = ecs_table_find_or_create(world, &entities);
    if (!result) {
        return NULL;
    }

    if (result != node) {
        create_backlink_after_remove(result, node, remove);
    }

    return result;    
}